

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_init_layer_context(AV1_COMP *cpi)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  long in_RDI;
  int i;
  PRIMARY_RATE_CONTROL *lp_rc;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int tl;
  int sl;
  int mi_cols;
  int mi_rows;
  SVC *svc;
  AV1EncoderConfig *oxcf;
  AV1_COMMON *cm;
  int local_54;
  size_t num;
  int local_30;
  int local_2c;
  
  *(undefined8 *)(in_RDI + 0x9d350) = 0x403e000000000000;
  *(undefined4 *)(in_RDI + 0x9d358) = 0;
  *(undefined4 *)(in_RDI + 0x9d4a8) = 1;
  *(undefined4 *)(in_RDI + 0x9d3a8) = 0;
  *(undefined4 *)(in_RDI + 0x9d348) = 0;
  *(undefined4 *)(in_RDI + 0x9d4ac) = 0;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x9d338); local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x9d33c); local_30 = local_30 + 1) {
      sVar2 = *(long *)(in_RDI + 0x9d488) +
              (long)(local_2c * *(int *)(in_RDI + 0x9d33c) + local_30) * 0x3380;
      pvVar3 = (void *)(sVar2 + 0x140);
      *(undefined4 *)(sVar2 + 0x94) = *(undefined4 *)(in_RDI + 0x423d0);
      *(undefined8 *)(sVar2 + 0x2338) = 0;
      *(undefined4 *)(sVar2 + 0x98) = 0;
      *(undefined8 *)(sVar2 + 0x22c0) = 0;
      *(undefined8 *)(sVar2 + 0x2300) = 0;
      *(undefined4 *)(sVar2 + 0x22b8) = 0;
      *(undefined4 *)(sVar2 + 0xa0) = 0;
      *(undefined4 *)(sVar2 + 0x9c) = 0;
      num = sVar2;
      iVar1 = av1_quantizer_to_qindex(*(int *)(sVar2 + 0x334c));
      *(int *)(num + 0xbc) = iVar1;
      iVar1 = av1_quantizer_to_qindex(*(int *)(sVar2 + 0x3350));
      *(int *)(num + 0xc0) = iVar1;
      *(undefined4 *)(num + 0x100) = 0;
      for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
        *(undefined8 *)((long)pvVar3 + (long)local_54 * 8 + 0x21d8) = 0x3ff0000000000000;
      }
      *(undefined8 *)(sVar2 + 0x3330) = *(undefined8 *)(sVar2 + 0x3320);
      *(undefined4 *)((long)pvVar3 + 0x21cc) = *(undefined4 *)(num + 0xbc);
      *(undefined4 *)((long)pvVar3 + 0x2190) = *(undefined4 *)(num + 0xbc);
      *(undefined4 *)((long)pvVar3 + 0x218c) = *(undefined4 *)(num + 0xbc);
      *(long *)((long)pvVar3 + 0x2208) =
           (*(long *)(in_RDI + 0x42390) * *(long *)(sVar2 + 0x3330)) / 1000;
      *(undefined8 *)((long)pvVar3 + 0x2228) = *(undefined8 *)((long)pvVar3 + 0x2208);
      if ((1 < *(int *)(in_RDI + 0x9d338)) && (local_30 == 0)) {
        *(undefined4 *)(sVar2 + 0x3358) = 0;
        *(undefined4 *)(sVar2 + 0x3368) = 0;
        *(undefined4 *)(sVar2 + 0x336c) = 0;
        *(undefined4 *)(sVar2 + 0x3370) = 0;
        aom_free(pvVar3);
        pvVar3 = aom_calloc(num,(size_t)pvVar3);
        *(void **)(sVar2 + 0x3360) = pvVar3;
        if (*(long *)(sVar2 + 0x3360) == 0) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate lc->map");
        }
      }
    }
    *(undefined1 *)(in_RDI + 0x9d494 + (long)local_2c) = 3;
    *(undefined4 *)(in_RDI + 0x9d498 + (long)local_2c * 4) = 8;
    *(undefined1 *)(in_RDI + 0x9d4b4 + (long)local_2c) = 0;
    *(undefined1 *)(in_RDI + 0x9d4b8 + (long)local_2c) = 0;
  }
  if (*(int *)(in_RDI + 0x9d338) == 3) {
    *(undefined1 *)(in_RDI + 0x9d494) = 1;
  }
  return;
}

Assistant:

void av1_init_layer_context(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  SVC *const svc = &cpi->svc;
  int mi_rows = cpi->common.mi_params.mi_rows;
  int mi_cols = cpi->common.mi_params.mi_cols;
  svc->base_framerate = 30.0;
  svc->current_superframe = 0;
  svc->force_zero_mode_spatial_ref = 1;
  svc->num_encoded_top_layer = 0;
  svc->use_flexible_mode = 0;
  svc->has_lower_quality_layer = 0;

  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      RATE_CONTROL *const lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
      lrc->ni_av_qi = oxcf->rc_cfg.worst_allowed_q;
      lp_rc->total_actual_bits = 0;
      lrc->ni_tot_qi = 0;
      lp_rc->tot_q = 0.0;
      lp_rc->avg_q = 0.0;
      lp_rc->ni_frames = 0;
      lrc->decimation_count = 0;
      lrc->decimation_factor = 0;
      lrc->worst_quality = av1_quantizer_to_qindex(lc->max_q);
      lrc->best_quality = av1_quantizer_to_qindex(lc->min_q);
      lrc->rtc_external_ratectrl = 0;
      for (int i = 0; i < RATE_FACTOR_LEVELS; ++i) {
        lp_rc->rate_correction_factors[i] = 1.0;
      }
      lc->target_bandwidth = lc->layer_target_bitrate;
      lp_rc->last_q[INTER_FRAME] = lrc->worst_quality;
      lp_rc->avg_frame_qindex[INTER_FRAME] = lrc->worst_quality;
      lp_rc->avg_frame_qindex[KEY_FRAME] = lrc->worst_quality;
      lp_rc->buffer_level =
          oxcf->rc_cfg.starting_buffer_level_ms * lc->target_bandwidth / 1000;
      lp_rc->bits_off_target = lp_rc->buffer_level;
      // Initialize the cyclic refresh parameters. If spatial layers are used
      // (i.e., ss_number_layers > 1), these need to be updated per spatial
      // layer. Cyclic refresh is only applied on base temporal layer.
      if (svc->number_spatial_layers > 1 && tl == 0) {
        lc->sb_index = 0;
        lc->actual_num_seg1_blocks = 0;
        lc->actual_num_seg2_blocks = 0;
        lc->counter_encode_maxq_scene_change = 0;
        aom_free(lc->map);
        CHECK_MEM_ERROR(cm, lc->map,
                        aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
      }
    }
    svc->downsample_filter_type[sl] = BILINEAR;
    svc->downsample_filter_phase[sl] = 8;
    svc->last_layer_dropped[sl] = false;
    svc->drop_spatial_layer[sl] = false;
  }
  if (svc->number_spatial_layers == 3) {
    svc->downsample_filter_type[0] = EIGHTTAP_SMOOTH;
  }
}